

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_perform_subscription_callback(void *s_,void *msg_)

{
  long *plVar1;
  char cVar2;
  undefined1 uVar3;
  code *pcVar4;
  void *__ptr;
  fio_defer_task_s task;
  long lVar5;
  long lVar6;
  fio_lock_i ret;
  fio_lock_i ret_1;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 local_e8 [2];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined1 local_a0;
  long local_98;
  undefined8 local_90;
  long local_88;
  undefined4 local_80 [2];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  
  LOCK();
  cVar2 = *(char *)((long)s_ + 0x40);
  *(char *)((long)s_ + 0x40) = '\x01';
  UNLOCK();
  local_e8[0] = CONCAT31(local_e8[0]._1_3_,cVar2);
  uStack_f8 = SUB84(s_,0);
  uStack_f4 = (undefined4)((ulong)s_ >> 0x20);
  if (cVar2 == '\0') {
    local_e8[0] = *(undefined4 *)((long)msg_ + 0x38);
    local_d0 = *(undefined8 *)((long)msg_ + 0x10);
    local_e0 = *msg_;
    uStack_d8 = *(undefined8 *)((long)msg_ + 8);
    local_c8 = *(undefined8 *)((long)msg_ + 0x18);
    uStack_c0 = *(undefined8 *)((long)msg_ + 0x20);
    local_b8 = *(undefined8 *)((long)msg_ + 0x28);
    local_b0 = *(undefined4 *)((long)s_ + 0x28);
    uStack_ac = *(undefined4 *)((long)s_ + 0x2c);
    uStack_a8 = *(undefined4 *)((long)s_ + 0x30);
    uStack_a4 = *(undefined4 *)((long)s_ + 0x34);
    local_a0 = 0;
    local_98 = 0;
    local_90 = *(undefined8 *)((long)msg_ + 0x40);
    local_88 = (long)msg_ + 0x48;
    if (*(code **)((long)s_ + 0x18) != (code *)0x0) {
      (**(code **)((long)s_ + 0x18))(local_e8);
    }
    LOCK();
    uVar3 = *(undefined1 *)((long)s_ + 0x40);
    *(undefined1 *)((long)s_ + 0x40) = 0;
    UNLOCK();
    local_80[0] = CONCAT31(local_80[0]._1_3_,uVar3);
    if (local_98 == 0) {
      LOCK();
      plVar1 = (long *)((long)msg_ + 0x30);
      *plVar1 = *plVar1 + -1;
      UNLOCK();
      if (*plVar1 == 0) {
        if (*(long *)((long)msg_ + 0x40) != 0) {
          lVar6 = *(long *)((long)msg_ + 0x40);
          do {
            lVar5 = lVar6 + -1;
            *(long *)((long)msg_ + 0x40) = lVar5;
            pcVar4 = *(code **)((long)msg_ + lVar6 * 0x18 + 0x38);
            if (pcVar4 != (code *)0x0) {
              local_80[0] = 0;
              local_68 = *(undefined8 *)((long)msg_ + 0x10);
              local_78 = *msg_;
              uStack_70 = *(undefined8 *)((long)msg_ + 8);
              local_50 = *(undefined8 *)((long)msg_ + 0x28);
              local_60 = *(undefined8 *)((long)msg_ + 0x18);
              uStack_58 = *(undefined8 *)((long)msg_ + 0x20);
              local_48 = 0;
              uStack_40 = 0;
              local_38 = 0;
              (*pcVar4)(local_80,*(undefined8 *)((long)msg_ + lVar5 * 0x18 + 0x58));
              lVar5 = *(long *)((long)msg_ + 0x40);
            }
            lVar6 = lVar5;
          } while (lVar5 != 0);
        }
        fio_free(msg_);
      }
      LOCK();
      plVar1 = (long *)((long)s_ + 0x38);
      *plVar1 = *plVar1 + -1;
      UNLOCK();
      if (*plVar1 != 0) {
        return;
      }
      if (*(code **)((long)s_ + 0x20) != (code *)0x0) {
        (**(code **)((long)s_ + 0x20))
                  (*(undefined8 *)((long)s_ + 0x28),*(undefined8 *)((long)s_ + 0x30));
      }
      __ptr = *(void **)((long)s_ + 0x10);
      if (__ptr != (void *)0x0) {
        LOCK();
        plVar1 = (long *)((long)__ptr + 0x10);
        *plVar1 = *plVar1 + -1;
        UNLOCK();
        if (*plVar1 == 0) {
          free(__ptr);
        }
      }
      fio_free(s_);
      return;
    }
  }
  task.arg1._0_4_ = uStack_f8;
  task.func = fio_perform_subscription_callback;
  task.arg1._4_4_ = uStack_f4;
  task.arg2 = msg_;
  fio_defer_push_task_fn(task,&task_queue_normal);
  return;
}

Assistant:

static void fio_perform_subscription_callback(void *s_, void *msg_) {
  subscription_s *s = s_;
  if (fio_trylock(&s->lock)) {
    fio_defer_push_task(fio_perform_subscription_callback, s_, msg_);
    return;
  }
  fio_msg_internal_s *msg = (fio_msg_internal_s *)msg_;
  fio_msg_client_s m = {
      .msg =
          {
              .channel = msg->channel,
              .msg = msg->data,
              .filter = msg->filter,
              .udata1 = s->udata1,
              .udata2 = s->udata2,
          },
      .meta_len = msg->meta_len,
      .meta = msg->meta,
      .marker = 0,
  };
  if (s->on_message) {
    /* the on_message callback is removed when a subscription is canceled. */
    s->on_message(&m.msg);
  }
  fio_unlock(&s->lock);
  if (m.marker) {
    fio_defer_push_task(fio_perform_subscription_callback, s_, msg_);
    return;
  }
  fio_msg_internal_free(msg);
  fio_subscription_free(s);
}